

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

bool __thiscall
cmELFInternalImpl<cmELFTypes64>::Read(cmELFInternalImpl<cmELFTypes64> *this,ELF_Dyn *x)

{
  istream *piVar1;
  long *plVar2;
  
  plVar2 = (long *)std::istream::read((char *)(this->super_cmELFInternal).Stream,(long)x);
  if (((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) &&
     ((this->super_cmELFInternal).NeedSwap == true)) {
    ByteSwap(this,x);
  }
  piVar1 = (this->super_cmELFInternal).Stream;
  return ((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0;
}

Assistant:

bool Read(ELF_Dyn& x)
  {
    if (this->Stream.read(reinterpret_cast<char*>(&x), sizeof(x)) &&
        this->NeedSwap) {
      ByteSwap(x);
    }
    return !this->Stream.fail();
  }